

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_fspic.cpp
# Opt level: O0

void __thiscall
DHUDPicManager::DoDraw(DHUDPicManager *this,int linenum,int x,int y,int hudheight,float translucent)

{
  int iVar1;
  DFrameBuffer *this_00;
  bool bVar2;
  uint uVar3;
  FHudPic *pFVar4;
  FTexture *img;
  FTexture *tex;
  uint i;
  float translucent_local;
  int hudheight_local;
  int y_local;
  int x_local;
  int linenum_local;
  DHUDPicManager *this_local;
  
  for (tex._0_4_ = 0; uVar3 = TArray<FHudPic,_FHudPic>::Size(&this->piclist), (uint)tex < uVar3;
      tex._0_4_ = (uint)tex + 1) {
    pFVar4 = TArray<FHudPic,_FHudPic>::operator[](&this->piclist,(ulong)(uint)tex);
    bVar2 = FTextureID::isValid(&pFVar4->texturenum);
    if ((bVar2) &&
       (pFVar4 = TArray<FHudPic,_FHudPic>::operator[](&this->piclist,(ulong)(uint)tex),
       (pFVar4->draw & 1U) != 0)) {
      pFVar4 = TArray<FHudPic,_FHudPic>::operator[](&this->piclist,(ulong)(uint)tex);
      img = FTextureManager::operator[](&TexMan,(FTextureID)(pFVar4->texturenum).texnum);
      this_00 = screen;
      if (img != (FTexture *)0x0) {
        pFVar4 = TArray<FHudPic,_FHudPic>::operator[](&this->piclist,(ulong)(uint)tex);
        iVar1 = pFVar4->xpos;
        pFVar4 = TArray<FHudPic,_FHudPic>::operator[](&this->piclist,(ulong)(uint)tex);
        DCanvas::DrawTexture
                  ((DCanvas *)this_00,img,(double)iVar1,(double)pFVar4->ypos,0x40001391,
                   (double)(translucent * this->basetrans),1,0x4000138c,0);
      }
    }
  }
  return;
}

Assistant:

void DHUDPicManager::DoDraw (int linenum, int x, int y, int hudheight, float translucent)
{
	for(unsigned int i=0; i<piclist.Size();i++) if (piclist[i].texturenum.isValid() && piclist[i].draw)
	{
		FTexture * tex = TexMan[piclist[i].texturenum];
		if (tex) screen->DrawTexture(tex, piclist[i].xpos, piclist[i].ypos, DTA_320x200, true, 
										DTA_AlphaF, translucent*basetrans, TAG_DONE);
	}
}